

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  char *pcVar1;
  bool bVar2;
  stringstream_t *psVar3;
  ostream *poVar4;
  long in_RDI;
  stringstream reasonStream;
  ulong in_stack_fffffffffffffb98;
  char (*log) [45];
  Storage *in_stack_fffffffffffffba0;
  LineNumber in_stack_fffffffffffffba8;
  LogDispatcher *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  Level level;
  Writer *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  VerboseLevel VVar5;
  string *in_stack_fffffffffffffbd0;
  LineNumber in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  Level level_00;
  LogMessage *in_stack_fffffffffffffbf0;
  Writer *this_00;
  Logger *in_stack_fffffffffffffc00;
  LogDispatcher *this_01;
  string local_3b8 [32];
  stringstream local_398 [16];
  ostream local_388 [168];
  Writer local_210;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [55];
  allocator local_139;
  string local_138 [312];
  
  level = (Level)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  level_00 = (Level)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  VVar5 = (VerboseLevel)((ulong)in_stack_fffffffffffffbc8 >> 0x30);
  if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
    this_01 = *(LogDispatcher **)(in_RDI + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,&this_01->m_proceed,&local_139);
    pcVar1 = *(char **)(in_RDI + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,pcVar1,&local_171);
    in_stack_fffffffffffffb98 = *(ulong *)(in_RDI + 0x30);
    LogMessage::LogMessage
              (in_stack_fffffffffffffbf0,level_00,in_stack_fffffffffffffbe0,
               in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,VVar5,in_stack_fffffffffffffc00);
    LogDispatcher::LogDispatcher
              (in_stack_fffffffffffffbb0,SUB81(in_stack_fffffffffffffba8 >> 0x38,0),
               (LogMessage *)in_stack_fffffffffffffba0,
               (DispatchAction)(in_stack_fffffffffffffb98 >> 0x20));
    LogDispatcher::dispatch(this_01);
    LogDispatcher::~LogDispatcher((LogDispatcher *)0x274053);
    LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  VVar5 = (VerboseLevel)in_stack_fffffffffffffbd0;
  if (*(long *)(in_RDI + 0x30) != 0) {
    psVar3 = Logger::stream_abi_cxx11_(*(Logger **)(in_RDI + 0x30));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"",&local_199);
    std::__cxx11::stringstream::str((string *)psVar3);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
  }
  if (((*(byte *)(in_RDI + 0x38) & 1) != 0) && (*(int *)(in_RDI + 8) == 8)) {
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x27426c);
    bVar2 = Storage::hasFlag(in_stack_fffffffffffffba0,
                             (LoggingFlag)(in_stack_fffffffffffffb98 >> 0x20));
    if (!bVar2) {
      log = (char (*) [45])(in_stack_fffffffffffffb98 & 0xffffffff00000000);
      this_00 = &local_210;
      Writer(in_stack_fffffffffffffbc0,level,&in_stack_fffffffffffffbb0->m_proceed,
             in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0,
             (DispatchAction)(in_stack_fffffffffffffb98 >> 0x20),VVar5);
      construct(this_00,1,consts::kDefaultLoggerId);
      operator<<((Writer *)in_stack_fffffffffffffba0,log);
      operator<<((Writer *)in_stack_fffffffffffffba0,(char **)log);
      operator<<((Writer *)in_stack_fffffffffffffba0,(char (*) [2])log);
      operator<<((Writer *)in_stack_fffffffffffffba0,(unsigned_long *)log);
      operator<<((Writer *)in_stack_fffffffffffffba0,(char (*) [2])log);
      ~Writer((Writer *)in_stack_fffffffffffffba0);
      std::__cxx11::stringstream::stringstream(local_398);
      poVar4 = std::operator<<(local_388,"Fatal log at [");
      poVar4 = std::operator<<(poVar4,*(char **)(in_RDI + 0x10));
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(in_RDI + 0x18));
      poVar4 = std::operator<<(poVar4,"]");
      poVar4 = std::operator<<(poVar4," If you wish to disable \'abort on fatal log\' please use ");
      std::operator<<(poVar4,
                      "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)");
      std::__cxx11::stringstream::str();
      utils::abort();
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::stringstream::~stringstream(local_398);
    }
  }
  *(undefined1 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    base::LogDispatcher(m_proceed, LogMessage(m_level, m_file, m_line, m_func, m_verboseLevel,
                        m_logger), m_dispatchAction).dispatch();
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Loggers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}